

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::LinearCost::setCostBias
          (LinearCost *this,double stateCostBias,double controlCostBias)

{
  TimeInvariantObject<double> *__p;
  __shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,_(__gnu_cxx::_Lock_policy)2>
  *in_RDI;
  double *in_stack_ffffffffffffffa8;
  TimeInvariantObject<double> *in_stack_ffffffffffffffb0;
  TimeInvariantObject<double> *this_00;
  TimeInvariantObject<double> *in_stack_ffffffffffffffb8;
  
  operator_new(0x10);
  TimeInvariantObject<double>::TimeInvariantObject
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,(__gnu_cxx::_Lock_policy)2>
  ::reset<iDynTree::optimalcontrol::TimeInvariantObject<double>>(in_RDI,in_stack_ffffffffffffffb8);
  this_00 = (TimeInvariantObject<double> *)&in_RDI[7]._M_refcount;
  __p = (TimeInvariantObject<double> *)operator_new(0x10);
  TimeInvariantObject<double>::TimeInvariantObject(this_00,in_stack_ffffffffffffffa8);
  std::__shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<double>,(__gnu_cxx::_Lock_policy)2>
  ::reset<iDynTree::optimalcontrol::TimeInvariantObject<double>>(in_RDI,__p);
  return true;
}

Assistant:

bool LinearCost::setCostBias(double stateCostBias, double controlCostBias)
        {
            m_timeVaryingStateCostBias.reset(new TimeInvariantDouble(stateCostBias));
            m_timeVaryingControlCostBias.reset(new TimeInvariantDouble(controlCostBias));
            return true;
        }